

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionAlgorithmsBullet.cpp
# Opt level: O2

void __thiscall
chrono::collision::cbtCylshellBoxCollisionAlgorithm::processCollision
          (cbtCylshellBoxCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0,
          cbtCollisionObjectWrapper *body1,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  ulong uVar1;
  float fVar2;
  cbtTransform *this_00;
  cbtCollisionShape *this_01;
  cbtCollisionShape *this_02;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  cbtManifoldResult *pcVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  cbtCollisionObjectWrapper *pcVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  int k;
  cbtScalar cH;
  cbtScalar cVar18;
  undefined1 auVar19 [16];
  undefined1 auVar22 [56];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar28 [56];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  cbtVector3 cVar34;
  int local_184;
  cbtScalar tMin;
  cbtVector3 local_178;
  cbtManifoldResult *local_160;
  long local_158;
  cbtVector3 v;
  cbtScalar tMax;
  cbtVector3 cs;
  cbtVector3 r;
  float local_118;
  cbtVector3 a;
  cbtVector3 pMid;
  cbtVector3 c;
  cbtVector3 pMax;
  cbtVector3 pMin;
  cbtVector3 hdims;
  cbtTransform box_X_cyl;
  
  if (this->m_manifoldPtr != (cbtPersistentManifold *)0x0) {
    bVar8 = this->m_isSwapped;
    resultOut->m_manifoldPtr = this->m_manifoldPtr;
    pcVar14 = body1;
    if (bVar8 != false) {
      pcVar14 = body0;
      body0 = body1;
    }
    this_00 = pcVar14->m_worldTransform;
    this_01 = pcVar14->m_shape;
    this_02 = body0->m_shape;
    local_160 = resultOut;
    cbtTransform::inverseTimes(&box_X_cyl,this_00,body0->m_worldTransform);
    auVar28 = (undefined1  [56])0x0;
    auVar24 = vinsertps_avx((undefined1  [16])box_X_cyl.m_basis.m_el._4_16_,
                            ZEXT416((uint)box_X_cyl.m_basis.m_el[1].m_floats[1]),0x10);
    a.m_floats = (cbtScalar  [4])
                 vmovlhps_avx(auVar24,ZEXT416((uint)box_X_cyl.m_basis.m_el[2].m_floats[1]));
    auVar22 = ZEXT856((ulong)box_X_cyl.m_origin.m_floats._8_8_);
    c.m_floats[0] = box_X_cyl.m_origin.m_floats[0];
    c.m_floats[1] = box_X_cyl.m_origin.m_floats[1];
    c.m_floats[2] = box_X_cyl.m_origin.m_floats[2];
    c.m_floats[3] = box_X_cyl.m_origin.m_floats[3];
    cVar34 = cbtBoxShape::getHalfExtentsWithMargin((cbtBoxShape *)this_01);
    auVar25._0_8_ = cVar34.m_floats._8_8_;
    auVar25._8_56_ = auVar28;
    auVar29._0_8_ = cVar34.m_floats._0_8_;
    auVar29._8_56_ = auVar22;
    hdims.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar29._0_16_,auVar25._0_16_);
    cVar34 = cbtCylindricalShellShape::getHalfExtentsWithMargin((cbtCylindricalShellShape *)this_02)
    ;
    local_118 = cVar34.m_floats[0];
    cH = cbtCylindricalShellShape::getHalfLength((cbtCylindricalShellShape *)this_02);
    auVar29 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
    lVar12 = 0;
    local_184 = 0;
    while( true ) {
      auVar22 = (undefined1  [56])0x0;
      if (lVar12 == 3) break;
      local_178.m_floats[0] = 0.0;
      local_178.m_floats[1] = 0.0;
      local_178.m_floats[2] = 0.0;
      local_178.m_floats[3] = 0.0;
      fVar2 = a.m_floats[lVar12];
      local_178.m_floats[lVar12] = 1.0;
      auVar24 = vandps_avx(ZEXT416((uint)(fVar2 + -1.0)),auVar29._0_16_);
      if (1e-05 <= auVar24._0_4_) {
        auVar24 = vandps_avx(ZEXT416((uint)(fVar2 + 1.0)),auVar29._0_16_);
        auVar28 = ZEXT856(auVar24._8_8_);
        if (1e-05 <= auVar24._0_4_) {
          local_158 = lVar12;
          cVar34 = cbtVector3::cross(&local_178,&a);
          auVar26._0_8_ = cVar34.m_floats._8_8_;
          auVar26._8_56_ = auVar22;
          auVar20._0_8_ = cVar34.m_floats._0_8_;
          auVar20._8_56_ = auVar28;
          v.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar20._0_16_,auVar26._0_16_);
          auVar28 = ZEXT856(v.m_floats._8_8_);
          cVar34 = cbtVector3::cross(&v,&a);
          auVar27._0_8_ = cVar34.m_floats._8_8_;
          auVar27._8_56_ = auVar22;
          auVar21._0_8_ = cVar34.m_floats._0_8_;
          auVar21._8_56_ = auVar28;
          r.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar21._0_16_,auVar27._0_16_);
          cVar18 = cbtVector3::length(&r);
          if (cVar18 <= 1e-05) {
            __assert_fail("r.length() > parallel_tol",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/ChCollisionAlgorithmsBullet.cpp"
                          ,0x178,
                          "virtual void chrono::collision::cbtCylshellBoxCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper *, const cbtCollisionObjectWrapper *, const cbtDispatcherInfo &, cbtManifoldResult *)"
                         );
          }
          cbtVector3::normalize(&r);
          lVar16 = 0;
          while( true ) {
            auVar29 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
            lVar12 = local_158;
            if (lVar16 == 8) break;
            fVar2 = local_118 * *(float *)((long)&DAT_00f483b8 + lVar16);
            auVar19._0_4_ = r.m_floats[0] * fVar2 + c.m_floats[0];
            auVar19._4_4_ = r.m_floats[1] * fVar2 + c.m_floats[1];
            auVar19._8_4_ = fVar2 * 0.0 + 0.0;
            auVar19._12_4_ = fVar2 * 0.0 + 0.0;
            cs.m_floats = (cbtScalar  [4])
                          vinsertps_avx(auVar19,ZEXT416((uint)(fVar2 * r.m_floats[2] + c.m_floats[2]
                                                              )),0x28);
            bVar8 = bt_utils::IntersectSegmentBox(&hdims,&cs,&a,cH,1e-05,&tMin,&tMax);
            if (bVar8) {
              fVar4 = a.m_floats[0];
              fVar5 = a.m_floats[1];
              fVar2 = cs.m_floats[0];
              auVar30._0_4_ = tMin * fVar4 + fVar2;
              fVar3 = cs.m_floats[1];
              auVar30._4_4_ = tMin * fVar5 + fVar3;
              auVar30._8_4_ = tMin * 0.0 + 0.0;
              auVar30._12_4_ = tMin * 0.0 + 0.0;
              pMin.m_floats =
                   (cbtScalar  [4])
                   vinsertps_avx(auVar30,ZEXT416((uint)(tMin * a.m_floats[2] + cs.m_floats[2])),0x28
                                );
              fVar6 = (tMin + tMax) * 0.5;
              auVar32._0_4_ = fVar2 + fVar4 * tMax;
              auVar32._4_4_ = fVar3 + fVar5 * tMax;
              auVar32._8_4_ = tMax * 0.0 + 0.0;
              auVar32._12_4_ = tMax * 0.0 + 0.0;
              pMax.m_floats =
                   (cbtScalar  [4])
                   vinsertps_avx(auVar32,ZEXT416((uint)(cs.m_floats[2] + a.m_floats[2] * tMax)),0x28
                                );
              auVar23._0_4_ = fVar2 + fVar4 * fVar6;
              auVar23._4_4_ = fVar3 + fVar5 * fVar6;
              auVar23._8_4_ = fVar6 * 0.0 + 0.0;
              auVar23._12_4_ = fVar6 * 0.0 + 0.0;
              pMid.m_floats =
                   (cbtScalar  [4])
                   vinsertps_avx(auVar23,ZEXT416((uint)(cs.m_floats[2] + a.m_floats[2] * fVar6)),
                                 0x28);
              iVar9 = bt_utils::FindClosestBoxFace(&hdims,&pMid);
              pcVar7 = local_160;
              iVar10 = addContactPoint(&pMin,iVar9,&hdims,this_00,local_160);
              iVar11 = addContactPoint(&pMax,iVar9,&hdims,this_00,pcVar7);
              iVar9 = addContactPoint(&pMid,iVar9,&hdims,this_00,pcVar7);
              local_184 = iVar9 + iVar11 + iVar10 + local_184;
            }
            lVar16 = lVar16 + 4;
          }
        }
      }
      lVar12 = lVar12 + 1;
    }
    if (local_184 < 1) {
      uVar1 = 0;
      while (uVar17 = uVar1, uVar17 != 3) {
        cVar18 = hdims.m_floats[uVar17];
        uVar1 = uVar17 + 1;
        local_178.m_floats[0] = 0.0;
        local_178.m_floats[1] = 0.0;
        local_178.m_floats[2] = 0.0;
        local_178.m_floats[3] = 0.0;
        local_178.m_floats[uVar17] = 1.0;
        uVar15 = 0;
        if (uVar1 != 3) {
          uVar15 = uVar1 & 0xffffffff;
        }
        local_158 = CONCAT44(local_158._4_4_,cVar18);
        uVar13 = (ulong)((int)uVar17 - 1);
        if (uVar17 == 0) {
          uVar13 = 2;
        }
        for (iVar9 = -1; iVar9 < 2; iVar9 = iVar9 + 2) {
          for (iVar10 = -1; iVar10 < 2; iVar10 = iVar10 + 2) {
            v.m_floats[uVar17] = 0.0;
            v.m_floats[uVar15] = (float)iVar9 * hdims.m_floats[uVar15];
            v.m_floats[uVar13] = (float)iVar10 * hdims.m_floats[uVar13];
            bVar8 = bt_utils::IntersectSegmentCylinder
                              (&v,&local_178,(cbtScalar)local_158,&c,&a,cH,local_118,1e-05,
                               pMax.m_floats,pMid.m_floats);
            pcVar7 = local_160;
            if (bVar8) {
              fVar4 = local_178.m_floats[0];
              fVar5 = local_178.m_floats[1];
              fVar2 = v.m_floats[0];
              auVar31._0_4_ = pMax.m_floats[0] * fVar4 + fVar2;
              fVar3 = v.m_floats[1];
              auVar31._4_4_ = pMax.m_floats[0] * fVar5 + fVar3;
              auVar31._8_4_ = pMax.m_floats[0] * 0.0 + 0.0;
              auVar31._12_4_ = pMax.m_floats[0] * 0.0 + 0.0;
              r.m_floats = (cbtScalar  [4])
                           vinsertps_avx(auVar31,ZEXT416((uint)(pMax.m_floats[0] *
                                                                local_178.m_floats[2] +
                                                               v.m_floats[2])),0x28);
              fVar6 = (pMax.m_floats[0] + pMid.m_floats[0]) * 0.5;
              auVar33._0_4_ = fVar2 + fVar4 * pMid.m_floats[0];
              auVar33._4_4_ = fVar3 + fVar5 * pMid.m_floats[0];
              auVar33._8_4_ = pMid.m_floats[0] * 0.0 + 0.0;
              auVar33._12_4_ = pMid.m_floats[0] * 0.0 + 0.0;
              cs.m_floats = (cbtScalar  [4])
                            vinsertps_avx(auVar33,ZEXT416((uint)(v.m_floats[2] +
                                                                local_178.m_floats[2] *
                                                                pMid.m_floats[0])),0x28);
              auVar24._0_4_ = fVar2 + fVar4 * fVar6;
              auVar24._4_4_ = fVar3 + fVar5 * fVar6;
              auVar24._8_4_ = fVar6 * 0.0 + 0.0;
              auVar24._12_4_ = fVar6 * 0.0 + 0.0;
              pMin.m_floats =
                   (cbtScalar  [4])
                   vinsertps_avx(auVar24,ZEXT416((uint)(v.m_floats[2] +
                                                       local_178.m_floats[2] * fVar6)),0x28);
              cVar18 = pMin.m_floats[0];
              addContactPoint(&r,&c,&a,cVar18,local_118,this_00,local_160);
              addContactPoint(&cs,&c,&a,cVar18,local_118,this_00,pcVar7);
              addContactPoint(&pMin,&c,&a,cVar18,local_118,this_00,pcVar7);
            }
          }
        }
      }
      if ((this->m_ownManifold != false) && (this->m_manifoldPtr->m_cachedPoints != 0)) {
        cbtManifoldResult::refreshContactPoints(local_160);
      }
    }
  }
  return;
}

Assistant:

void cbtCylshellBoxCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0,
                                                        const cbtCollisionObjectWrapper* body1,
                                                        const cbtDispatcherInfo& dispatchInfo,
                                                        cbtManifoldResult* resultOut) {
    (void)dispatchInfo;
    (void)resultOut;
    if (!m_manifoldPtr)
        return;

    const cbtCollisionObjectWrapper* cylObjWrap = m_isSwapped ? body1 : body0;
    const cbtCollisionObjectWrapper* boxObjWrap = m_isSwapped ? body0 : body1;

    resultOut->setPersistentManifold(m_manifoldPtr);

    const cbtCylindricalShellShape* cyl = (cbtCylindricalShellShape*)cylObjWrap->getCollisionShape();
    const cbtBoxShape* box = (cbtBoxShape*)boxObjWrap->getCollisionShape();

    // Express cylinder in the box frame
    const cbtTransform& abs_X_cyl = cylObjWrap->getWorldTransform();
    const cbtTransform& abs_X_box = boxObjWrap->getWorldTransform();
    cbtTransform box_X_cyl = abs_X_box.inverseTimes(abs_X_cyl);

    cbtVector3 a = box_X_cyl.getBasis().getColumn(1);  // cylinder axis (expressed in box frame)
    cbtVector3 c = box_X_cyl.getOrigin();              // cylinder center (expressed in box frame)

    // Box dimensions
    cbtVector3 hdims = box->getHalfExtentsWithMargin();

    // Cylinder dimensions
    cbtScalar radius = cyl->getRadius();    // cylinder radius
    cbtScalar hlen = cyl->getHalfLength();  // cylinder half-length

    const cbtScalar parallel_tol = cbtScalar(1e-5);  // tolearance for parallelism tests

    int num_contacts = 0;

    // - Loop over each direction of the box frame (i.e., each of the 3 face normals).
    // - For each direction, consider two segments on the cylindrical surface that are on a plane defined by the axis
    //   and the face normal. (Note that, in principle, we could only consider the segment "closest" to the box, but
    //   that is not trivial to define in all configurations). All segments are parameterized by t in [-H,H].
    // - For each segment, if the segment intersects the box, consider 3 candidate contact points: the 2 intersection
    //   points and their midpoint. A contact is added if the segment point is inside the box.
    //   Furthermore, the corresponding box point is located on the box face that is closest to the intersection
    //   midpoint candidate.
    for (int idir = 0; idir < 3; idir++) {
        // current box direction
        cbtVector3 ndir(0, 0, 0);
        ndir[idir] = 1;

        // If the axis is parallel to the current direction, no contact.
        if (std::abs(a[idir] - 1) < parallel_tol || std::abs(a[idir] + 1) < parallel_tol)
            continue;

        // Direction perpendicular to cylinder axis (in direction opposite to ndir)
        cbtVector3 v = ndir.cross(a);
        cbtVector3 r = v.cross(a);
        assert(r.length() > parallel_tol);
        r.normalize();

        // Consider segments in both "negative" and "positive" r direction
        cbtScalar dir[2] = {-1, 1};
        for (int jdir = 0; jdir < 2; jdir++) {
            // Calculate current segment center
            cbtVector3 cs = c + dir[jdir] * radius * r;
            // Check for intersection with box
            cbtScalar tMin, tMax;
            if (bt_utils::IntersectSegmentBox(hdims, cs, a, hlen, parallel_tol, tMin, tMax)) {
                // Consider the intersection points and their midpoint as candidates
                cbtVector3 pMin = cs + a * tMin;
                cbtVector3 pMax = cs + a * tMax;
                cbtVector3 pMid = cs + a * ((tMin + tMax) / 2);

                // Pick box face that is closest to midpoint
                int iface = bt_utils::FindClosestBoxFace(hdims, pMid);

                // Add a contact for any of the candidate points that is inside the box
                num_contacts += addContactPoint(pMin, iface, hdims, abs_X_box, resultOut);  // 1st segment end
                num_contacts += addContactPoint(pMax, iface, hdims, abs_X_box, resultOut);  // 2nd segment end
                num_contacts += addContactPoint(pMid, iface, hdims, abs_X_box, resultOut);  // intersection midpoint
            }
        }
    }

    // If a box face supports the cylinder, do not check box edges.
    if (num_contacts > 0)
        return;

    // - Loop over each direction of the box frame.
    // - For each direction, check intersection with the cylinder for all 4 edges parallel to that direction.
    // - If an edge intersects the cylinder, consider 3 candidate contact points: the 2 intersection points
    //   and their midpoint.
    for (int idir = 0; idir < 3; idir++) {
        // current box edge direction and halflength
        cbtVector3 eD(0, 0, 0);
        eD[idir] = 1;
        cbtScalar eH = hdims[idir];
        // The other two box directions
        int jdir = (idir + 1) % 3;
        int kdir = (idir + 2) % 3;
        for (int j = -1; j <= +1; j += 2) {
            for (int k = -1; k <= +1; k += 2) {
                cbtVector3 eC;
                eC[idir] = 0;
                eC[jdir] = j * hdims[jdir];
                eC[kdir] = k * hdims[kdir];
                // Check for edge intersection with cylinder
                cbtScalar tMin, tMax;
                if (bt_utils::IntersectSegmentCylinder(eC, eD, eH, c, a, hlen, radius, parallel_tol, tMin, tMax)) {
                    // Consider the intersection points and their midpoint as candidates
                    cbtVector3 pMin = eC + eD * tMin;
                    cbtVector3 pMax = eC + eD * tMax;
                    cbtVector3 pMid = eC + eD * ((tMin + tMax) / 2);

                    // Add a contact for any of the candidate points that is inside the cylinder
                    num_contacts += addContactPoint(pMin, c, a, hlen, radius, abs_X_box, resultOut);
                    num_contacts += addContactPoint(pMax, c, a, hlen, radius, abs_X_box, resultOut);
                    num_contacts += addContactPoint(pMid, c, a, hlen, radius, abs_X_box, resultOut);
                }
            }
        }
    }

    ////std::cout << num_contacts << std::endl;

    if (m_ownManifold && m_manifoldPtr->getNumContacts()) {
        resultOut->refreshContactPoints();
    }
}